

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_4_6_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int i;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  float *pfVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  float *pfVar45;
  float *pfVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [12];
  undefined1 auVar81 [64];
  float fVar83;
  undefined1 in_ZMM8 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [64];
  
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  fVar61 = ipoint->scale;
  auVar87 = ZEXT464((uint)fVar61);
  auVar51 = ZEXT816(0x3fe0000000000000);
  auVar81 = ZEXT1664(auVar51);
  auVar56 = ZEXT416((uint)fVar61);
  auVar47 = vpternlogd_avx512vl(auVar55,auVar56,auVar54,0xf8);
  auVar47 = ZEXT416((uint)(fVar61 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  fVar59 = -0.08 / (fVar61 * fVar61);
  iVar32 = (int)auVar47._0_4_;
  auVar48._0_4_ = (int)auVar47._0_4_;
  auVar48._4_4_ = (int)auVar47._4_4_;
  auVar48._8_4_ = (int)auVar47._8_4_;
  auVar48._12_4_ = (int)auVar47._12_4_;
  auVar47 = vcvtdq2ps_avx(auVar48);
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->x),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->x + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49._0_8_ = (double)auVar48._0_4_;
  auVar49._8_8_ = auVar48._8_8_;
  auVar53._0_8_ = (double)fVar61;
  auVar53._8_8_ = 0;
  auVar48 = vfmadd231sd_fma(auVar49,auVar53,auVar51);
  auVar52._0_4_ = (float)auVar48._0_8_;
  auVar52._4_12_ = auVar48._4_12_;
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->y),auVar54,0xf8);
  fVar3 = auVar52._0_4_ - auVar47._0_4_;
  auVar48 = ZEXT416((uint)(ipoint->y + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50._0_8_ = (double)auVar48._0_4_;
  auVar50._8_8_ = auVar48._8_8_;
  auVar48 = vfmadd231sd_fma(auVar50,auVar53,auVar51);
  auVar51._0_4_ = (float)auVar48._0_8_;
  auVar51._4_12_ = auVar48._4_12_;
  fVar86 = auVar51._0_4_ - auVar47._0_4_;
  auVar49 = ZEXT416((uint)fVar61);
  auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar49,auVar52);
  auVar48 = vpternlogd_avx512vl(auVar55,auVar47,auVar54,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  if (iVar32 < (int)auVar47._0_4_) {
    auVar57._8_4_ = 0x3effffff;
    auVar57._0_8_ = 0x3effffff3effffff;
    auVar57._12_4_ = 0x3effffff;
    auVar58._8_4_ = 0x80000000;
    auVar58._0_8_ = 0x8000000080000000;
    auVar58._12_4_ = 0x80000000;
    auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar49,auVar51);
    auVar48 = vpternlogd_avx512vl(auVar58,auVar47,auVar57,0xea);
    auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
    auVar47 = vroundss_avx(auVar47,auVar47,0xb);
    if (iVar32 < (int)auVar47._0_4_) {
      auVar47 = vfmadd231ss_fma(auVar52,auVar49,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar48 = vpternlogd_avx512vl(auVar78,auVar47,auVar57,0xea);
      auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
      auVar47 = vroundss_avx(auVar47,auVar47,0xb);
      if ((int)auVar47._0_4_ + iVar32 <= iimage->width) {
        auVar47 = vfmadd231ss_fma(auVar51,auVar49,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar48 = vpternlogd_avx512vl(auVar57,auVar47,auVar13,0xf8);
        auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
        auVar47 = vroundss_avx(auVar47,auVar47,0xb);
        if ((int)auVar47._0_4_ + iVar32 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          fVar86 = fVar86 + 0.5;
          lVar43 = 0xc0;
          for (uVar35 = 0xfffffff4; (int)uVar35 < 0xc; uVar35 = uVar35 + 4) {
            auVar47._0_4_ = (float)(int)uVar35;
            auVar82 = in_ZMM8._4_12_;
            auVar47._4_12_ = auVar82;
            auVar48 = auVar87._0_16_;
            auVar47 = vfmadd213ss_fma(auVar47,auVar48,ZEXT416((uint)fVar86));
            iVar23 = (int)auVar47._0_4_;
            auVar63._0_4_ = (float)(int)(uVar35 | 1);
            auVar63._4_12_ = auVar82;
            auVar47 = vfmadd213ss_fma(auVar63,auVar48,ZEXT416((uint)fVar86));
            iVar22 = (int)auVar47._0_4_;
            auVar64._0_4_ = (float)(int)(uVar35 | 2);
            auVar64._4_12_ = auVar82;
            auVar47 = vfmadd213ss_fma(auVar64,auVar48,ZEXT416((uint)fVar86));
            iVar21 = (int)auVar47._0_4_;
            auVar65._0_4_ = (float)(int)(uVar35 | 3);
            auVar65._4_12_ = auVar82;
            auVar47 = vfmadd213ss_fma(auVar65,auVar48,ZEXT416((uint)fVar86));
            iVar20 = (int)auVar47._0_4_;
            lVar44 = lVar43;
            for (iVar29 = -0xc; iVar29 < 0xc; iVar29 = iVar29 + 6) {
              auVar66._0_4_ = (float)iVar29;
              auVar66._4_12_ = in_ZMM8._4_12_;
              auVar47 = vfmadd213ss_fma(auVar66,auVar56,ZEXT416((uint)fVar3));
              iVar41 = (int)auVar47._0_4_;
              auVar67._0_4_ = (float)(iVar29 + 1);
              auVar82 = auVar81._4_12_;
              auVar67._4_12_ = auVar82;
              auVar47 = vfmadd213ss_fma(auVar67,auVar56,ZEXT416((uint)fVar3));
              iVar24 = (int)auVar47._0_4_;
              auVar68._0_4_ = (float)(iVar29 + 2);
              auVar68._4_12_ = auVar82;
              auVar48 = ZEXT416((uint)fVar3);
              auVar47 = vfmadd213ss_fma(auVar68,auVar56,auVar48);
              iVar25 = (int)auVar47._0_4_;
              auVar69._0_4_ = (float)(iVar29 + 3);
              auVar69._4_12_ = auVar82;
              auVar47 = vfmadd213ss_fma(auVar69,auVar56,auVar48);
              iVar26 = (int)auVar47._0_4_;
              auVar70._0_4_ = (float)(iVar29 + 4);
              auVar70._4_12_ = auVar82;
              auVar47 = vfmadd213ss_fma(auVar70,auVar56,auVar48);
              iVar27 = (int)auVar47._0_4_;
              auVar71._0_4_ = (float)(iVar29 + 5);
              auVar71._4_12_ = auVar82;
              auVar47 = vfmadd213ss_fma(auVar71,auVar56,auVar48);
              iVar28 = (int)auVar47._0_4_;
              haarXY_unconditional
                        (iimage,iVar23,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + -0xc0)
                         ,(float *)((long)haarResponseY + lVar44 + -0xc0));
              haarXY_unconditional
                        (iimage,iVar22,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + -0x60)
                         ,(float *)((long)haarResponseY + lVar44 + -0x60));
              haarXY_unconditional
                        (iimage,iVar21,iVar41,iVar32,(float *)((long)haarResponseX + lVar44),
                         (float *)((long)haarResponseY + lVar44));
              haarXY_unconditional
                        (iimage,iVar20,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + 0x60),
                         (float *)((long)haarResponseY + lVar44 + 0x60));
              haarXY_unconditional
                        (iimage,iVar23,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + -0xbc)
                         ,(float *)((long)haarResponseY + lVar44 + -0xbc));
              haarXY_unconditional
                        (iimage,iVar22,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + -0x5c)
                         ,(float *)((long)haarResponseY + lVar44 + -0x5c));
              haarXY_unconditional
                        (iimage,iVar21,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + 4),
                         (float *)((long)haarResponseY + lVar44 + 4));
              haarXY_unconditional
                        (iimage,iVar20,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + 100),
                         (float *)((long)haarResponseY + lVar44 + 100));
              haarXY_unconditional
                        (iimage,iVar23,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb8)
                         ,(float *)((long)haarResponseY + lVar44 + -0xb8));
              haarXY_unconditional
                        (iimage,iVar22,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + -0x58)
                         ,(float *)((long)haarResponseY + lVar44 + -0x58));
              haarXY_unconditional
                        (iimage,iVar21,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + 8),
                         (float *)((long)haarResponseY + lVar44 + 8));
              haarXY_unconditional
                        (iimage,iVar20,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + 0x68),
                         (float *)((long)haarResponseY + lVar44 + 0x68));
              haarXY_unconditional
                        (iimage,iVar23,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb4)
                         ,(float *)((long)haarResponseY + lVar44 + -0xb4));
              haarXY_unconditional
                        (iimage,iVar22,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + -0x54)
                         ,(float *)((long)haarResponseY + lVar44 + -0x54));
              haarXY_unconditional
                        (iimage,iVar21,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + 0xc),
                         (float *)((long)haarResponseY + lVar44 + 0xc));
              haarXY_unconditional
                        (iimage,iVar20,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + 0x6c),
                         (float *)((long)haarResponseY + lVar44 + 0x6c));
              haarXY_unconditional
                        (iimage,iVar23,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb0)
                         ,(float *)((long)haarResponseY + lVar44 + -0xb0));
              haarXY_unconditional
                        (iimage,iVar22,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + -0x50)
                         ,(float *)((long)haarResponseY + lVar44 + -0x50));
              haarXY_unconditional
                        (iimage,iVar21,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + 0x10),
                         (float *)((long)haarResponseY + lVar44 + 0x10));
              haarXY_unconditional
                        (iimage,iVar20,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + 0x70),
                         (float *)((long)haarResponseY + lVar44 + 0x70));
              haarXY_unconditional
                        (iimage,iVar23,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + -0xac)
                         ,(float *)((long)haarResponseY + lVar44 + -0xac));
              haarXY_unconditional
                        (iimage,iVar22,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + -0x4c)
                         ,(float *)((long)haarResponseY + lVar44 + -0x4c));
              haarXY_unconditional
                        (iimage,iVar21,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + 0x14),
                         (float *)((long)haarResponseY + lVar44 + 0x14));
              haarXY_unconditional
                        (iimage,iVar20,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + 0x74),
                         (float *)((long)haarResponseY + lVar44 + 0x74));
              lVar44 = lVar44 + 0x18;
            }
            auVar87 = ZEXT1664(auVar56);
            lVar43 = lVar43 + 0x180;
          }
          goto LAB_001935a8;
        }
      }
    }
  }
  lVar43 = 0xc0;
  for (uVar35 = 0xfffffff4; (int)uVar35 < 0xc; uVar35 = uVar35 + 4) {
    auVar62._0_4_ = (float)(int)uVar35;
    auVar82 = in_ZMM8._4_12_;
    auVar62._4_12_ = auVar82;
    auVar49 = auVar87._0_16_;
    auVar47 = vfmadd213ss_fma(auVar62,auVar49,ZEXT416((uint)fVar86));
    auVar73._0_4_ = (float)(int)(uVar35 | 1);
    auVar73._4_12_ = auVar82;
    fVar60 = auVar47._0_4_;
    auVar76._0_4_ = (float)(int)(uVar35 | 2);
    auVar76._4_12_ = auVar82;
    auVar79._0_4_ = (float)(int)(uVar35 | 3);
    auVar79._4_12_ = auVar82;
    auVar47 = vfmadd213ss_fma(auVar73,auVar49,ZEXT416((uint)fVar86));
    auVar48 = vfmadd213ss_fma(auVar76,auVar49,ZEXT416((uint)fVar86));
    auVar49 = vfmadd213ss_fma(auVar79,auVar49,ZEXT416((uint)fVar86));
    fVar72 = auVar47._0_4_;
    iVar20 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
    fVar60 = auVar48._0_4_;
    iVar21 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
    fVar72 = auVar49._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
    iVar23 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
    lVar44 = lVar43;
    for (iVar29 = -0xc; iVar29 < 0xc; iVar29 = iVar29 + 6) {
      auVar47 = vpbroadcastd_avx512vl();
      auVar47 = vpaddd_avx(auVar47,_DAT_002716a0);
      auVar74._0_4_ = (float)iVar29;
      auVar74._4_12_ = in_ZMM8._4_12_;
      auVar48 = vfmadd213ss_fma(auVar74,auVar56,ZEXT416((uint)fVar3));
      auVar77._0_4_ = (float)(iVar29 + 1);
      auVar77._4_12_ = in_ZMM8._4_12_;
      auVar49 = vfmadd213ss_fma(auVar77,auVar56,ZEXT416((uint)fVar3));
      fVar60 = auVar48._0_4_;
      fVar72 = auVar49._0_4_;
      iVar41 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
      auVar47 = vcvtdq2ps_avx(auVar47);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      auVar19._4_4_ = fVar3;
      auVar19._0_4_ = fVar3;
      auVar19._8_4_ = fVar3;
      auVar19._12_4_ = fVar3;
      auVar18._4_4_ = fVar61;
      auVar18._0_4_ = fVar61;
      auVar18._8_4_ = fVar61;
      auVar18._12_4_ = fVar61;
      auVar48 = vfmadd132ps_fma(auVar47,auVar19,auVar18);
      uVar31 = vcmpps_avx512vl(auVar48,_DAT_002711c0,0xd);
      auVar47 = vshufps_avx(auVar48,auVar48,0xff);
      bVar15 = (byte)(uVar31 >> 3);
      bVar16 = (byte)(uVar31 >> 2);
      bVar17 = (byte)(uVar31 >> 1);
      iVar25 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      auVar47 = vshufpd_avx(auVar48,auVar48,1);
      iVar26 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      auVar47 = vmovshdup_avx(auVar48);
      iVar27 = (int)((double)((ulong)(bVar17 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar17 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      iVar28 = (int)((double)((ulong)((byte)uVar31 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)((byte)uVar31 & 1) * -0x4020000000000000) +
                    (double)auVar48._0_4_);
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + -0xc0),
                 (float *)((long)haarResponseY + lVar44 + -0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + -0x60),
                 (float *)((long)haarResponseY + lVar44 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar41,iVar32,(float *)((long)haarResponseX + lVar44),
                 (float *)((long)haarResponseY + lVar44));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar41,iVar32,(float *)((long)haarResponseX + lVar44 + 0x60),
                 (float *)((long)haarResponseY + lVar44 + 0x60));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + -0xbc),
                 (float *)((long)haarResponseY + lVar44 + -0xbc));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + -0x5c),
                 (float *)((long)haarResponseY + lVar44 + -0x5c));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + 4),
                 (float *)((long)haarResponseY + lVar44 + 4));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar24,iVar32,(float *)((long)haarResponseX + lVar44 + 100),
                 (float *)((long)haarResponseY + lVar44 + 100));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb8),
                 (float *)((long)haarResponseY + lVar44 + -0xb8));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + -0x58),
                 (float *)((long)haarResponseY + lVar44 + -0x58));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + 8),
                 (float *)((long)haarResponseY + lVar44 + 8));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar25,iVar32,(float *)((long)haarResponseX + lVar44 + 0x68),
                 (float *)((long)haarResponseY + lVar44 + 0x68));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb4),
                 (float *)((long)haarResponseY + lVar44 + -0xb4));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + -0x54),
                 (float *)((long)haarResponseY + lVar44 + -0x54));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + 0xc),
                 (float *)((long)haarResponseY + lVar44 + 0xc));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar26,iVar32,(float *)((long)haarResponseX + lVar44 + 0x6c),
                 (float *)((long)haarResponseY + lVar44 + 0x6c));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + -0xb0),
                 (float *)((long)haarResponseY + lVar44 + -0xb0));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + -0x50),
                 (float *)((long)haarResponseY + lVar44 + -0x50));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + 0x10),
                 (float *)((long)haarResponseY + lVar44 + 0x10));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar27,iVar32,(float *)((long)haarResponseX + lVar44 + 0x70),
                 (float *)((long)haarResponseY + lVar44 + 0x70));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + -0xac),
                 (float *)((long)haarResponseY + lVar44 + -0xac));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + -0x4c),
                 (float *)((long)haarResponseY + lVar44 + -0x4c));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + 0x14),
                 (float *)((long)haarResponseY + lVar44 + 0x14));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar28,iVar32,(float *)((long)haarResponseX + lVar44 + 0x74),
                 (float *)((long)haarResponseY + lVar44 + 0x74));
      lVar44 = lVar44 + 0x18;
    }
    auVar87 = ZEXT1664(auVar56);
    lVar43 = lVar43 + 0x180;
  }
LAB_001935a8:
  fVar86 = auVar87._0_4_;
  auVar85._8_4_ = 0x3effffff;
  auVar85._0_8_ = 0x3effffff3effffff;
  auVar85._12_4_ = 0x3effffff;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar47 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 0.5)),auVar84,0xf8);
  auVar47 = ZEXT416((uint)(fVar86 * 0.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 1.5)),auVar84,0xf8);
  auVar48 = ZEXT416((uint)(fVar86 * 1.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 2.5)),auVar84,0xf8);
  auVar49 = ZEXT416((uint)(fVar86 * 2.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 3.5)),auVar84,0xf8);
  auVar50 = ZEXT416((uint)(fVar86 * 3.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 4.5)),auVar84,0xf8);
  auVar51 = ZEXT416((uint)(fVar86 * 4.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 5.5)),auVar84,0xf8);
  auVar52 = ZEXT416((uint)(fVar86 * 5.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 6.5)),auVar84,0xf8);
  auVar53 = ZEXT416((uint)(fVar86 * 6.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 7.5)),auVar84,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar86 * 7.5));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 8.5)),auVar84,0xf8);
  auVar55 = ZEXT416((uint)(fVar86 * 8.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 9.5)),auVar84,0xf8);
  auVar56 = ZEXT416((uint)(fVar86 * 9.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 10.5)),auVar84,0xf8);
  auVar57 = ZEXT416((uint)(fVar86 * 10.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 11.5)),auVar84,0xf8);
  fVar75 = auVar49._0_4_;
  fVar61 = fVar75 + auVar48._0_4_;
  fVar3 = fVar75 + auVar47._0_4_;
  auVar49 = ZEXT416((uint)(fVar86 * 11.5 + auVar58._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  fVar86 = fVar75 - auVar47._0_4_;
  fVar60 = fVar75 - auVar48._0_4_;
  fVar72 = fVar75 - auVar50._0_4_;
  fVar4 = fVar75 - auVar51._0_4_;
  fVar5 = fVar75 - auVar52._0_4_;
  fVar75 = fVar75 - auVar53._0_4_;
  fVar83 = auVar54._0_4_;
  fVar6 = fVar83 - auVar50._0_4_;
  fVar7 = fVar83 - auVar51._0_4_;
  fVar8 = fVar83 - auVar52._0_4_;
  fVar9 = fVar83 - auVar53._0_4_;
  fVar10 = fVar83 - auVar55._0_4_;
  fVar11 = fVar83 - auVar56._0_4_;
  fVar12 = fVar83 - auVar57._0_4_;
  fVar83 = fVar83 - auVar49._0_4_;
  gauss_s1_c0[0] = expf(fVar61 * fVar61 * fVar59);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar59);
  gauss_s1_c0[2] = expf(fVar86 * fVar86 * fVar59);
  gauss_s1_c0[3] = expf(fVar60 * fVar60 * fVar59);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar72 * fVar72 * fVar59);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar59);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar59);
  gauss_s1_c0[8] = expf(fVar75 * fVar75 * fVar59);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar59);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar59);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar59);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar59);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar59);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar59);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar59);
  gauss_s1_c1[8] = expf(fVar83 * fVar83 * fVar59);
  auVar81 = ZEXT1264(ZEXT812(0));
  lVar43 = 0;
  auVar56._8_4_ = 0x7fffffff;
  auVar56._0_8_ = 0x7fffffff7fffffff;
  auVar56._12_4_ = 0x7fffffff;
  iVar32 = 0;
  lVar44 = 0;
  uVar31 = 0xfffffffffffffff8;
  while (uVar35 = (uint)uVar31, (int)uVar35 < 8) {
    pfVar45 = gauss_s1_c1;
    if (uVar35 != 7) {
      pfVar45 = gauss_s1_c0;
    }
    lVar42 = (long)iVar32;
    lVar44 = (long)(int)lVar44;
    iVar32 = iVar32 + 4;
    if (uVar35 == 0xfffffff8) {
      pfVar45 = gauss_s1_c1;
    }
    uVar33 = 0;
    uVar39 = 0xfffffffffffffff8;
    lVar34 = lVar43;
    while (lVar42 != iVar32) {
      pfVar46 = gauss_s1_c1;
      iVar29 = (int)uVar39;
      if (iVar29 != 7) {
        pfVar46 = gauss_s1_c0;
      }
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar39 = (ulong)((uint)(uVar39 >> 0x1c) & 8);
      if (iVar29 == -8) {
        pfVar46 = gauss_s1_c1;
      }
      lVar36 = (long)haarResponseX + lVar34;
      lVar37 = (long)haarResponseY + lVar34;
      for (uVar30 = uVar33; uVar30 < iVar29 * 0x18 + 0x198; uVar30 = uVar30 + 0x18) {
        lVar38 = 0;
        pfVar40 = (float *)((long)pfVar45 + (ulong)(((uint)(uVar31 >> 0x1f) & 1) << 5));
        while (lVar38 != 9) {
          fVar61 = *pfVar40;
          pfVar40 = pfVar40 + (ulong)(~uVar35 >> 0x1f) * 2 + -1;
          lVar1 = lVar38 * 4;
          lVar2 = lVar38 * 4;
          lVar38 = lVar38 + 1;
          auVar49 = ZEXT416((uint)(pfVar46[uVar39] * fVar61 * *(float *)(lVar36 + lVar2)));
          auVar47 = vandps_avx(auVar49,auVar56);
          auVar50 = ZEXT416((uint)(pfVar46[uVar39] * fVar61 * *(float *)(lVar37 + lVar1)));
          auVar48 = vandps_avx(auVar50,auVar56);
          auVar49 = vinsertps_avx(auVar50,auVar49,0x10);
          auVar48 = vmovlhps_avx(auVar49,auVar48);
          auVar47 = vinsertps_avx(auVar48,auVar47,0x30);
          auVar87 = ZEXT1664(CONCAT412(auVar87._12_4_ + auVar47._12_4_,
                                       CONCAT48(auVar87._8_4_ + auVar47._8_4_,
                                                CONCAT44(auVar87._4_4_ + auVar47._4_4_,
                                                         auVar87._0_4_ + auVar47._0_4_))));
        }
        uVar39 = uVar39 + (ulong)(-1 < iVar29) * 2 + -1;
        lVar36 = lVar36 + 0x60;
        lVar37 = lVar37 + 0x60;
      }
      uVar39 = (ulong)(iVar29 + 5);
      uVar33 = uVar33 + 0x78;
      lVar34 = lVar34 + 0x1e0;
      fVar61 = gauss_s2_arr[lVar42];
      auVar14._4_4_ = fVar61;
      auVar14._0_4_ = fVar61;
      auVar14._8_4_ = fVar61;
      auVar14._12_4_ = fVar61;
      auVar50 = vmulps_avx512vl(auVar87._0_16_,auVar14);
      lVar42 = lVar42 + 1;
      auVar80._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar80._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar80._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar80._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar48 = vshufpd_avx(auVar50,auVar50,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar44) = auVar50;
      lVar44 = lVar44 + 4;
      auVar47 = vmovshdup_avx(auVar80);
      auVar49 = vfmadd231ss_fma(auVar47,auVar50,auVar50);
      auVar47 = vshufps_avx(auVar50,auVar50,0xff);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      auVar47 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      auVar81 = ZEXT464((uint)(auVar81._0_4_ + auVar47._0_4_));
    }
    lVar43 = lVar43 + 0x14;
    uVar31 = (ulong)(uVar35 + 5);
  }
  if (auVar81._0_4_ < 0.0) {
    fVar61 = sqrtf(auVar81._0_4_);
  }
  else {
    auVar47 = vsqrtss_avx(auVar81._0_16_,auVar81._0_16_);
    fVar61 = auVar47._0_4_;
  }
  for (lVar43 = 0; lVar43 != 0x40; lVar43 = lVar43 + 1) {
    ipoint->descriptor[lVar43] = (1.0 / fVar61) * ipoint->descriptor[lVar43];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}